

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  double dVar1;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double hnow;
  int local_48;
  int hlast;
  int hindex;
  int findex;
  double Qnew;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  Qnew = *f;
  for (local_48 = 0; local_48 < elen; local_48 = local_48 + 1) {
    dVar1 = Qnew + e[local_48];
    h[local_48] = (Qnew - (dVar1 - (dVar1 - Qnew))) + (e[local_48] - (dVar1 - Qnew));
    Qnew = dVar1;
  }
  h[local_48] = Qnew;
  hnow._4_4_ = local_48;
  for (hlast = 1; hlast < flen; hlast = hlast + 1) {
    Qnew = f[hlast];
    for (local_48 = hlast; local_48 <= hnow._4_4_; local_48 = local_48 + 1) {
      dVar1 = Qnew + h[local_48];
      h[local_48] = (Qnew - (dVar1 - (dVar1 - Qnew))) + (h[local_48] - (dVar1 - Qnew));
      Qnew = dVar1;
    }
    hnow._4_4_ = hnow._4_4_ + 1;
    h[hnow._4_4_] = Qnew;
  }
  return hnow._4_4_ + 1;
}

Assistant:

int expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int findex, hindex, hlast;
  REAL hnow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = f[0];
  for (hindex = 0; hindex < elen; hindex++) {
    hnow = e[hindex];
    Two_Sum(Q, hnow, Qnew, h[hindex]);
    Q = Qnew;
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    Q = f[findex];
    for (hindex = findex; hindex <= hlast; hindex++) {
      hnow = h[hindex];
      Two_Sum(Q, hnow, Qnew, h[hindex]);
      Q = Qnew;
    }
    h[++hlast] = Q;
  }
  return hlast + 1;
}